

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadOpcode(BinaryReader *this,Opcode *out_value,char *desc)

{
  byte bVar1;
  Result RVar2;
  uint uVar3;
  Enum EVar4;
  uint local_30;
  byte local_29;
  uint32_t code;
  uint8_t value;
  
  local_29 = 0;
  RVar2 = ReadU8(this,&local_29,"opcode");
  bVar1 = local_29;
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  uVar3 = (uint)local_29;
  if ((byte)(local_29 + 4) < 3) {
    RVar2 = ReadU32Leb128(this,&local_30,"opcode");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    if (0xff < local_30) {
      __assert_fail("code < 0x100",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/opcode.h"
                    ,0x6c,"static uint32_t wabt::Opcode::PrefixCode(uint8_t, uint32_t)");
    }
    uVar3 = (uint)bVar1 << 8 | local_30;
    EVar4 = WabtOpcodeCodeTable[uVar3];
    if ((local_30 == 0) || (EVar4 != Unreachable)) goto LAB_00f2d836;
  }
  else {
    EVar4 = WabtOpcodeCodeTable[local_29];
    if (local_29 == 0 || EVar4 != Unreachable) goto LAB_00f2d836;
  }
  EVar4 = -uVar3;
LAB_00f2d836:
  out_value->enum_ = EVar4;
  return (Result)Ok;
}

Assistant:

Result BinaryReader::ReadOpcode(Opcode* out_value, const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));

  if (Opcode::IsPrefixByte(value)) {
    uint32_t code;
    CHECK_RESULT(ReadU32Leb128(&code, desc));
    *out_value = Opcode::FromCode(value, code);
  } else {
    *out_value = Opcode::FromCode(value);
  }
  return Result::Ok;
}